

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::RelationalComparisonHelper
               (Var aLeft,Var aRight,ScriptContext *scriptContext,bool leftFirst,bool undefinedAs)

{
  ulong uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  JavascriptTypedNumber<unsigned_long> *pJVar9;
  JavascriptTypedNumber<long> *pJVar10;
  Type TVar11;
  Type TVar12;
  double value;
  undefined1 auVar13 [16];
  double local_38;
  
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_00aa5ce1:
  if ((undefined1 *)aLeft == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00aa6a45;
    *puVar7 = 0;
LAB_00aa5dbb:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
    TVar11 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar11) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
    if (TVar11 == TypeIds_Undefined) {
      aLeft = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).nan.ptr;
    }
    else if (TVar11 == TypeIds_Null) {
      aLeft = &DAT_1000000000000;
    }
  }
  else if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (aLeft < (undefined1 *)0x4000000000000 &&
        ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) goto LAB_00aa5dbb;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00aa6a45;
    *puVar7 = 0;
  }
  if ((undefined1 *)aRight == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00aa6a45;
    *puVar7 = 0;
LAB_00aa5f88:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
    TVar11 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar11) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
    if (TVar11 == TypeIds_Undefined) {
      aRight = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).nan.ptr;
    }
    else if (TVar11 == TypeIds_Null) {
      aRight = &DAT_1000000000000;
    }
  }
  else if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if (aRight < (undefined1 *)0x4000000000000 &&
        ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) goto LAB_00aa5f88;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00aa6a45;
    *puVar7 = 0;
  }
  if ((undefined1 *)aLeft == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00aa6a45;
    *puVar7 = 0;
LAB_00aa6133:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
    TVar11 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar11) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00aa6a45;
LAB_00aa6217:
      *puVar7 = 0;
    }
  }
  else {
    if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      TVar11 = TypeIds_FirstNumberType;
      if (bVar4) goto LAB_00aa6217;
      goto LAB_00aa6a45;
    }
    TVar11 = TypeIds_FirstNumberType;
    if ((((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) &&
       (TVar11 = TypeIds_Number, aLeft < (undefined1 *)0x4000000000000)) goto LAB_00aa6133;
  }
  if ((undefined1 *)aRight == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00aa6a45;
    *puVar7 = 0;
LAB_00aa62e5:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
    TVar12 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar12) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
LAB_00aa638f:
      if (bVar4 == false) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
  }
  else {
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      TVar12 = TypeIds_FirstNumberType;
      goto LAB_00aa638f;
    }
    TVar12 = TypeIds_FirstNumberType;
    if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
       (TVar12 = TypeIds_Number, aRight < (undefined1 *)0x4000000000000)) goto LAB_00aa62e5;
  }
  if ((TVar11 == TypeIds_BigInt) || (TVar12 == TypeIds_BigInt)) {
    if (TVar11 != TVar12) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x28c,"(leftType == rightType)",
                                  "do not support comparison with types other than BigInt");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
    bVar5 = JavascriptBigInt::LessThan(aLeft,aRight);
    goto LAB_00aa68ad;
  }
  switch(TVar11) {
  case TypeIds_Undefined:
  case TypeIds_Null:
  case TypeIds_Boolean:
  case TypeIds_Symbol:
    goto switchD_00aa645d_caseD_0;
  case TypeIds_FirstNumberType:
    value = (double)(int)aLeft;
    break;
  case TypeIds_Number:
    if (aLeft < (undefined1 *)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
    }
    value = (double)((ulong)aLeft ^ 0xfffc000000000000);
    break;
  case TypeIds_Int64Number:
    if (TVar12 == TypeIds_LastNumberType) {
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      uVar1 = pJVar10->m_value;
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      if ((-1 < (long)uVar1) && (bVar5 = uVar1 < pJVar9->m_value, pJVar9->m_value >> 0x1f == 0))
      goto LAB_00aa68ad;
    }
    else if (TVar12 == TypeIds_Int64Number) {
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      lVar2 = pJVar10->m_value;
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      bVar5 = lVar2 < pJVar10->m_value;
      goto LAB_00aa68ad;
    }
    pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
    value = (double)pJVar10->m_value;
    goto LAB_00aa67f5;
  case TypeIds_LastNumberType:
    if (TVar12 == TypeIds_LastNumberType) {
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      uVar1 = pJVar9->m_value;
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      bVar5 = uVar1 < pJVar9->m_value;
      goto LAB_00aa68ad;
    }
    if (TVar12 == TypeIds_Int64Number) {
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      uVar1 = pJVar9->m_value;
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      if ((uVar1 < 0x7fffffff) && (bVar5 = uVar1 < (ulong)pJVar10->m_value, -1 < pJVar10->m_value))
      goto LAB_00aa68ad;
    }
    pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
    auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar9->m_value);
    auVar13._8_4_ = (int)(pJVar9->m_value >> 0x20);
    auVar13._12_4_ = 0x45300000;
    value = (auVar13._0_8_ - 4503599627370496.0) + (auVar13._8_8_ - 1.9342813113834067e+25);
LAB_00aa67f5:
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00aa6511;
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00aa656b;
    goto LAB_00aa682c;
  case TypeIds_String:
    if (TVar12 - TypeIds_Boolean < 3) goto LAB_00aa646f;
    if (TVar12 == TypeIds_String) {
LAB_00aa678a:
      bVar5 = JavascriptString::LessThan(aLeft,aRight);
      goto LAB_00aa68ad;
    }
    aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
    if ((undefined1 *)aRight == (undefined1 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00aa6a45;
      *puVar7 = 0;
LAB_00aa694d:
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aRight);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00aa6a45;
        *puVar7 = 0;
      }
      TVar11 = ((pRVar8->type).ptr)->typeId;
      if ((int)TVar11 < 0x58) {
        if (TVar11 == TypeIds_String) goto LAB_00aa678a;
      }
      else {
        BVar6 = RecyclableObject::IsExternal(pRVar8);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) goto LAB_00aa6a45;
          *puVar7 = 0;
        }
      }
    }
    else {
      bVar4 = TaggedInt::Is(aRight);
      if (aRight < (undefined1 *)0x4000000000000 && !bVar4) goto LAB_00aa694d;
    }
    JavascriptConversion::ToNumber(aRight,scriptContext);
    goto LAB_00aa646f;
  default:
    goto switchD_00aa645d_default;
  }
  if (TVar12 == TypeIds_Number) {
    local_38 = JavascriptNumber::GetValue(aRight);
  }
  else if (TVar12 == TypeIds_FirstNumberType) {
    local_38 = (double)(int)aRight;
  }
  else {
    local_38 = JavascriptConversion::ToNumber(aRight,scriptContext);
  }
  goto LAB_00aa686c;
switchD_00aa645d_default:
  if (leftFirst) {
    aLeft = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aLeft,scriptContext);
    aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
  }
  else {
    aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
    aLeft = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aLeft,scriptContext);
  }
  goto LAB_00aa5ce1;
switchD_00aa645d_caseD_0:
LAB_00aa646f:
  if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) goto LAB_00aa64e9;
    if (aLeft < (undefined1 *)0x4000000000000) {
      value = JavascriptConversion::ToNumber_Full(aLeft,scriptContext);
    }
    else {
      value = (double)((ulong)aLeft ^ 0xfffc000000000000);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00aa6a45;
    *puVar7 = 0;
LAB_00aa64e9:
    value = (double)(int)aLeft;
  }
  if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
LAB_00aa682c:
      if (aRight < (undefined1 *)0x4000000000000) {
        local_38 = JavascriptConversion::ToNumber_Full(aRight,scriptContext);
      }
      else {
        local_38 = (double)((ulong)aRight ^ 0xfffc000000000000);
      }
      goto LAB_00aa686c;
    }
  }
  else {
LAB_00aa6511:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) {
LAB_00aa6a45:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
LAB_00aa656b:
  local_38 = (double)(int)aRight;
LAB_00aa686c:
  bVar4 = NumberUtilities::IsNan(value);
  bVar5 = undefinedAs;
  if ((!bVar4) && (bVar4 = NumberUtilities::IsNan(local_38), !bVar4)) {
    if ((value != local_38) || (NAN(value) || NAN(local_38))) {
      bVar5 = value < local_38;
    }
    else {
      bVar5 = 0;
    }
  }
LAB_00aa68ad:
  return (BOOL)bVar5;
}

Assistant:

BOOL JavascriptOperators::RelationalComparisonHelper(Var aLeft, Var aRight, ScriptContext* scriptContext, bool leftFirst, bool undefinedAs)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(aLeft);

        if (typeId == TypeIds_Null)
        {
            aLeft=TaggedInt::ToVarUnchecked(0);
        }
        else if (typeId == TypeIds_Undefined)
        {
            aLeft=scriptContext->GetLibrary()->GetNaN();
        }

        typeId = JavascriptOperators::GetTypeId(aRight);

        if (typeId == TypeIds_Null)
        {
            aRight=TaggedInt::ToVarUnchecked(0);
        }
        else if (typeId == TypeIds_Undefined)
        {
            aRight=scriptContext->GetLibrary()->GetNaN();
        }

        double dblLeft, dblRight;
        TypeId leftType = JavascriptOperators::GetTypeId(aLeft);
        TypeId rightType = JavascriptOperators::GetTypeId(aRight);

        if ((leftType == TypeIds_BigInt) || (rightType == TypeIds_BigInt))
        {
            // TODO: support comparison with types other than BigInt
            AssertOrFailFastMsg(leftType == rightType, "do not support comparison with types other than BigInt");
            return JavascriptBigInt::LessThan(aLeft, aRight);
        }

        switch (leftType)
        {
        case TypeIds_Integer:
            dblLeft = TaggedInt::ToDouble(aLeft);
            switch (rightType)
            {
            case TypeIds_Integer:
                dblRight = TaggedInt::ToDouble(aRight);
                break;
            case TypeIds_Number:
                dblRight = JavascriptNumber::GetValue(aRight);
                break;
            default:
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                break;
            }
            break;
        case TypeIds_Number:
            dblLeft = JavascriptNumber::GetValue(aLeft);
            switch (rightType)
            {
            case TypeIds_Integer:
                dblRight = TaggedInt::ToDouble(aRight);
                break;
            case TypeIds_Number:
                dblRight = JavascriptNumber::GetValue(aRight);
                break;
            default:
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                break;
            }
            break;
        case TypeIds_Int64Number:
            {
                switch (rightType)
                {
                case TypeIds_Int64Number:
                    {
                        __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                        __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                        return leftValue < rightValue;
                    }
                    break;
                case TypeIds_UInt64Number:
                    {
                        __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                        unsigned __int64 rightValue = UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                        if (rightValue <= INT_MAX && leftValue >= 0)
                        {
                            return leftValue < (__int64)rightValue;
                        }
                    }
                    break;
                }
                dblLeft = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            }
            break;

        // we cannot do double conversion between 2 int64 numbers as we can get wrong result after conversion
        // i.e., two different numbers become the same after losing precision. We'll continue dbl comparison
        // if either number is not an int64 number.
        case TypeIds_UInt64Number:
            {
                switch (rightType)
                {
                case TypeIds_Int64Number:
                    {
                        unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                        __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                        if (leftValue < INT_MAX && rightValue >= 0)
                        {
                            return (__int64)leftValue < rightValue;
                        }
                    }
                    break;
                case TypeIds_UInt64Number:
                    {
                        unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                        unsigned __int64 rightValue = UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                        return leftValue < rightValue;
                    }
                    break;
                }
                dblLeft = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            }
            break;

        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Boolean:
                break;
            default:
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
                rightType = JavascriptOperators::GetTypeId(aRight);
                if (rightType != TypeIds_String)
                {
                    dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                    break;
                }
            case TypeIds_String:
                return JavascriptString::LessThan(aLeft, aRight);
            }
            dblLeft = JavascriptConversion::ToNumber(aLeft, scriptContext);
            dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            break;
        case TypeIds_Boolean:
        case TypeIds_Null:
        case TypeIds_Undefined:
        case TypeIds_Symbol:
            dblLeft = JavascriptConversion::ToNumber(aLeft, scriptContext);
            dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            break;
        default:
            if (leftFirst)
            {
                aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
            }
            else
            {
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
                aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
            }
            //BugFix: When @@ToPrimitive of an object is overridden with a function that returns null/undefined
            //this helper will fall into a inescapable goto loop as the checks for null/undefined were outside of the path
            return RelationalComparisonHelper(aLeft, aRight, scriptContext, leftFirst, undefinedAs);
        }

        //
        // And +0,-0 that is not implemented fully
        //

        if (JavascriptNumber::IsNan(dblLeft) || JavascriptNumber::IsNan(dblRight))
        {
            return undefinedAs;
        }

        // this will succeed for -0.0 == 0.0 case as well
        if (dblLeft == dblRight)
        {
            return false;
        }

        return dblLeft < dblRight;
    }